

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O2

void __thiscall
QGestureManager::getGestureTargets
          (QGestureManager *this,QSet<QGesture_*> *gestures,
          QHash<QWidget_*,_QList<QGesture_*>_> *conflicts,
          QHash<QWidget_*,_QList<QGesture_*>_> *normal)

{
  Span *pSVar1;
  Span *pSVar2;
  Data *pDVar3;
  GestureType GVar4;
  QHash<QWidget*,QGesture*> *this_00;
  const_iterator cVar5;
  QList<QGesture_*> *this_01;
  ulong uVar6;
  long lVar7;
  const_iterator cVar8;
  QHash<QWidget_*,_QList<QGesture_*>_> *this_02;
  Data<QHashPrivate::Node<QWidget_*,_QGesture_*>_> *pDVar9;
  long in_FS_OFFSET;
  QWidget *widget;
  QWidget *receiver;
  QGesture *gesture;
  QWeakPointer<QObject> local_78;
  piter local_68;
  undefined1 local_58 [8];
  iterator<QHashPrivate::Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>_> local_50;
  QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d = (Data *)0x0;
  local_50 = (iterator<QHashPrivate::Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>_>)
             QHash<QGesture_*,_QHashDummyValue>::begin(&gestures->q_hash);
  while( true ) {
    if (local_50.d ==
        (Data<QHashPrivate::Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>_> *)0x0 &&
        local_50.bucket == 0) break;
    pSVar1 = (local_50.d)->spans;
    uVar6 = local_50.bucket >> 7;
    local_58 = *(undefined1 (*) [8])
                (((pSVar1[uVar6].entries)->storage).data +
                (ulong)pSVar1[uVar6].offsets[(uint)local_50.bucket & 0x7f] * 8);
    local_78.d = (Data *)0x0;
    local_78.value = (QObject *)0x0;
    QHash<QGesture_*,_QPointer<QWidget>_>::value
              ((QHash<QGesture_*,_QPointer<QWidget>_> *)&local_68,(QGesture **)(this + 0x40),
               (QPointer<QWidget> *)local_58);
    if ((local_68.d == (Data<QHashPrivate::Node<QWidget_*,_QGesture_*>_> *)0x0) ||
       (*(int *)&(local_68.d)->field_0x4 == 0)) {
      pDVar9 = (Data<QHashPrivate::Node<QWidget_*,_QGesture_*>_> *)0x0;
    }
    else {
      pDVar9 = (Data<QHashPrivate::Node<QWidget_*,_QGesture_*>_> *)local_68.bucket;
    }
    QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_68);
    QWeakPointer<QObject>::~QWeakPointer(&local_78);
    local_68.d = pDVar9;
    if (pDVar9 != (Data<QHashPrivate::Node<QWidget_*,_QGesture_*>_> *)0x0) {
      GVar4 = QGesture::gestureType((QGesture *)local_58);
      local_78.d = (Data *)CONCAT44(local_78.d._4_4_,GVar4);
      this_00 = (QHash<QWidget*,QGesture*> *)
                QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>::operator[]
                          (&local_40,(GestureType *)&local_78);
      QHash<QWidget*,QGesture*>::emplace<QGesture*const&>
                (this_00,(QWidget **)&local_68,(QGesture **)local_58);
    }
    QHashPrivate::iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::operator++
              ((iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)&local_50);
  }
  local_50 = (iterator<QHashPrivate::Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>_>)
             QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>::cbegin(&local_40);
  do {
    if (local_50.d ==
        (Data<QHashPrivate::Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>_> *)0x0 &&
        local_50.bucket == 0) {
      QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>::~QHash(&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    pSVar1 = (local_50.d)->spans;
    uVar6 = local_50.bucket >> 7;
    local_68.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (Data<QHashPrivate::Node<QWidget_*,_QGesture_*>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = (piter)QHash<QWidget_*,_QGesture_*>::cbegin
                                ((QHash<QWidget_*,_QGesture_*> *)
                                 (pSVar1[uVar6].entries
                                  [pSVar1[uVar6].offsets[(uint)local_50.bucket & 0x7f]].storage.data
                                 + 8));
    while( true ) {
      if (local_68.d == (Data<QHashPrivate::Node<QWidget_*,_QGesture_*>_> *)0x0 &&
          local_68.bucket == 0) break;
      pSVar2 = (local_68.d)->spans;
      uVar6 = local_68.bucket >> 7;
      local_78.d = *(Data **)pSVar2[uVar6].entries
                             [pSVar2[uVar6].offsets[(uint)local_68.bucket & 0x7f]].storage.data;
      lVar7 = *(long *)(local_78.d + 8);
      while (pDVar3 = *(Data **)(lVar7 + 0x10), this_02 = normal, pDVar3 != (Data *)0x0) {
        cVar5 = QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::find
                          ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)
                           (*(long *)(pDVar3 + 8) + 0x238),
                           (GestureType *)
                           ((local_50.d)->spans[local_50.bucket >> 7].entries +
                           (local_50.d)->spans[local_50.bucket >> 7].offsets
                           [(uint)local_50.bucket & 0x7f]));
        lVar7 = *(long *)(pDVar3 + 8);
        cVar8._M_node = (_Base_ptr)(*(long *)(lVar7 + 0x238) + 0x10);
        if (*(long *)(lVar7 + 0x238) == 0) {
          cVar8._M_node = (_Base_ptr)0x0;
        }
        if ((((cVar5.i._M_node != (const_iterator)cVar8._M_node) &&
             ((*(byte *)((long)cVar5.i._M_node + 0x24) & 1) == 0)) &&
            (this_02 = conflicts, pDVar3 != local_78.d)) ||
           (this_02 = normal, (*(byte *)(*(long *)(pDVar3 + 0x20) + 0xc) & 1) != 0)) break;
      }
      this_01 = QHash<QWidget_*,_QList<QGesture_*>_>::operator[](this_02,(QWidget **)&local_78);
      QList<QGesture_*>::append
                (this_01,*(parameter_type *)
                          ((local_68.d)->spans[local_68.bucket >> 7].entries
                           [(local_68.d)->spans[local_68.bucket >> 7].offsets
                            [(uint)local_68.bucket & 0x7f]].storage.data + 8));
      QHashPrivate::iterator<QHashPrivate::Node<QWidget_*,_QGesture_*>_>::operator++(&local_68);
    }
    QHashPrivate::iterator<QHashPrivate::Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>_>::
    operator++(&local_50);
  } while( true );
}

Assistant:

void QGestureManager::getGestureTargets(const QSet<QGesture*> &gestures,
    QHash<QWidget *, QList<QGesture *> > *conflicts,
    QHash<QWidget *, QList<QGesture *> > *normal)
{
    typedef QHash<Qt::GestureType, QHash<QWidget *, QGesture *> > GestureByTypes;
    GestureByTypes gestureByTypes;

    // sort gestures by types
    for (QGesture *gesture : gestures) {
        QWidget *receiver = m_gestureTargets.value(gesture, nullptr);
        Q_ASSERT(receiver);
        if (receiver)
            gestureByTypes[gesture->gestureType()].insert(receiver, gesture);
    }

    // for each gesture type
    for (GestureByTypes::const_iterator git = gestureByTypes.cbegin(), gend = gestureByTypes.cend(); git != gend; ++git) {
        const QHash<QWidget *, QGesture *> &gestures = git.value();
        for (QHash<QWidget *, QGesture *>::const_iterator wit = gestures.cbegin(), wend = gestures.cend(); wit != wend; ++wit) {
            QWidget *widget = wit.key();
            QWidget *w = widget->parentWidget();
            while (w) {
                QMap<Qt::GestureType, Qt::GestureFlags>::const_iterator it
                        = w->d_func()->gestureContext.constFind(git.key());
                if (it != w->d_func()->gestureContext.constEnd()) {
                    // i.e. 'w' listens to gesture 'type'
                    if (!(it.value() & Qt::DontStartGestureOnChildren) && w != widget) {
                        // conflicting gesture!
                        (*conflicts)[widget].append(wit.value());
                        break;
                    }
                }
                if (w->isWindow()) {
                    w = nullptr;
                    break;
                }
                w = w->parentWidget();
            }
            if (!w)
                (*normal)[widget].append(wit.value());
        }
    }
}